

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O3

PBuffer __thiscall DataSourceAmiga::get_sound(DataSourceAmiga *this,size_t index)

{
  Stream *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  PBuffer PVar2;
  PBuffer data;
  ConvertorSFX2WAV convertor;
  PBuffer local_c0;
  undefined1 local_b0 [16];
  ConvertorSFX2WAV local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  get_sound_data((DataSourceAmiga *)local_b0,index);
  if ((_func_int **)local_b0._0_8_ == (_func_int **)0x0) {
    local_40._M_pi = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"data","");
    Log::Logger::operator[]((Logger *)(local_b0 + 0x10),(string *)&Log::Error);
    this_00 = Log::Stream::operator<<((Stream *)(local_b0 + 0x10),"Sound sample with index");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00->stream);
    Log::Stream::operator<<(this_00," not present.");
    Log::Stream::~Stream((Stream *)(local_b0 + 0x10));
    _Var1._M_pi = extraout_RDX;
    if (local_40._M_pi != &local_30) {
      operator_delete(local_40._M_pi,
                      (ulong)((long)(_func_int ***)local_30._vptr__Sp_counted_base + 1));
      _Var1._M_pi = extraout_RDX_00;
    }
    (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
         (_func_int **)0x0;
    (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    local_c0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    local_c0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_b0._8_8_ + 8) = *(_Atomic_word *)(local_b0._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_b0._8_8_ + 8) = *(_Atomic_word *)(local_b0._8_8_ + 8) + 1;
      }
    }
    ConvertorSFX2WAV::ConvertorSFX2WAV((ConvertorSFX2WAV *)(local_b0 + 0x10),&local_c0,0,false);
    if (local_c0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    PVar2 = ConvertorPCM2WAV::convert((ConvertorPCM2WAV *)this);
    _Var1 = PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_a0.super_ConvertorPCM2WAV.super_Convertor._vptr_Convertor =
         (_func_int **)&PTR__ConvertorPCM2WAV_00157bd0;
    if (local_a0.super_ConvertorPCM2WAV.result.
        super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super_ConvertorPCM2WAV.result.
                 super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      _Var1._M_pi = extraout_RDX_01;
    }
    local_a0.super_ConvertorPCM2WAV.super_Convertor._vptr_Convertor =
         (_func_int **)&PTR__Convertor_001571d0;
    if (local_a0.super_ConvertorPCM2WAV.super_Convertor.buffer.
        super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super_ConvertorPCM2WAV.super_Convertor.buffer.
                 super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      _Var1._M_pi = extraout_RDX_02;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    _Var1._M_pi = extraout_RDX_03;
  }
  PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
DataSourceAmiga::get_sound(size_t index) {
  PBuffer data = get_sound_data(index);
  if (!data) {
    Log::Error["data"] << "Sound sample with index" << index << " not present.";
    return nullptr;
  }

  try {
    ConvertorSFX2WAV convertor(data);
    return convertor.convert();
  } catch (...) {
    Log::Error["data"] << "Could not convert SFX clip to WAV: #" << index;
    return nullptr;
  }
}